

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11TextureCalc.h
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmGen11TextureCalc::GmmTexGetMipDepth
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar2 = pTexInfo->Depth;
    if (((ulong)(pTexInfo->Flags).Info & 0x10) == 0) {
      uVar2 = uVar2 >> ((byte)MipLevel & 0x1f);
      uVar3 = uVar2 + (uVar2 == 0);
    }
    else {
      uVar3 = 1;
      if (uVar2 != 1) {
        bVar1 = (byte)MipLevel & 0x1f;
        uVar3 = 2;
        if (uVar2 - 1 >> bVar1 != 0) {
          uVar3 = (uVar2 - 1 >> bVar1) + 1;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

virtual uint32_t  GmmTexGetMipDepth(GMM_TEXTURE_INFO *pTexInfo, uint32_t MipLevel)
            {
                __GMM_ASSERTPTR(pTexInfo, 0);

                if (!pTexInfo->Flags.Info.CornerTexelMode)
                {
                    return(GFX_MAX(1, pTexInfo->Depth >> MipLevel));
                }
                else
                {
                    if (pTexInfo->Depth == 1)
                    {
                        return pTexInfo->Depth;
                    }
                    else
                    {
                        return(GFX_MAX(1, (pTexInfo->Depth - 1) >> MipLevel) + 1);
                    }
                }
            }